

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_xor_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  ushort key;
  shared_container_t *container;
  int *c;
  container_t *c_00;
  ushort *puVar1;
  int *piVar2;
  uint8_t uVar3;
  long lVar4;
  ushort uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint8_t type2;
  uint8_t result_type;
  uint8_t local_46;
  uint8_t local_45;
  uint local_44;
  roaring_array_t *local_40;
  ulong local_38;
  
  if (x1 == x2) {
    __assert_fail("x1 != x2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x3e2f,
                  "void roaring_bitmap_xor_inplace(roaring_bitmap_t *, const roaring_bitmap_t *)");
  }
  local_45 = '\0';
  local_44 = (x2->high_low_container).size;
  if (local_44 == 0) {
    return;
  }
  uVar10 = (x1->high_low_container).size;
  uVar6 = (ulong)uVar10;
  if (uVar10 == 0) {
    ra_overwrite(&x2->high_low_container,&x1->high_low_container,
                 (_Bool)((x2->high_low_container).flags & 1));
    return;
  }
  uVar5 = *(x1->high_low_container).keys;
  puVar1 = (x2->high_low_container).keys;
  uVar8 = 0;
  uVar11 = 0;
  local_40 = &x2->high_low_container;
LAB_001175de:
  do {
    uVar10 = (uint)uVar11;
    key = *puVar1;
    uVar8 = (ulong)(int)uVar8;
    uVar9 = (int)uVar6 - 1;
    while( true ) {
      uVar7 = (uint)uVar8;
      if (uVar5 == key) break;
      if (key <= uVar5) {
        local_46 = local_40->typecodes[uVar11 & 0xffff];
        c_00 = get_copy_of_container
                         (local_40->containers[uVar11 & 0xffff],&local_46,
                          (_Bool)(local_40->flags & 1));
        if ((local_40->flags & 1) != 0) {
          if (((roaring_array_t *)&local_40->size)->size <= (int)uVar10) goto LAB_0011786f;
          local_40->containers[(int)uVar10] = c_00;
          local_40->typecodes[(int)uVar10] = local_46;
        }
        ra_insert_new_key_value_at(&x1->high_low_container,uVar7,key,c_00,local_46);
        uVar9 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar9;
        uVar10 = uVar10 + 1;
        uVar11 = (ulong)uVar10;
        if (uVar10 != local_44) {
          uVar8 = uVar8 + 1;
          puVar1 = (ushort *)((ulong)((uVar10 & 0xffff) * 2) + (long)local_40->keys);
          goto LAB_001175de;
        }
        uVar7 = uVar7 + 1;
        uVar10 = local_44;
        goto LAB_00117828;
      }
      if (uVar9 == uVar7) goto LAB_0011782d;
      uVar8 = uVar8 + 1;
      uVar5 = (x1->high_low_container).keys[uVar8 & 0xffff];
    }
    uVar3 = (x1->high_low_container).typecodes[uVar8 & 0xffff];
    container = (shared_container_t *)(x1->high_low_container).containers[uVar8 & 0xffff];
    local_46 = local_40->typecodes[uVar11 & 0xffff];
    local_38 = uVar6;
    if (uVar3 == '\x04') {
      c = (int *)container_xor(container,'\x04',local_40->containers[uVar11 & 0xffff],local_46,
                               &local_45);
      shared_container_free(container);
    }
    else {
      c = (int *)container_ixor(container,uVar3,local_40->containers[uVar11 & 0xffff],local_46,
                                &local_45);
    }
    piVar2 = c;
    uVar3 = local_45;
    if (local_45 == '\x04') {
      uVar3 = (uint8_t)c[2];
      if (uVar3 == '\x04') {
        __assert_fail("*type != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1062,
                      "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
      }
      piVar2 = *(int **)c;
    }
    if ((uVar3 == '\x03') || (uVar3 == '\x02')) {
      if (*piVar2 < 1) goto LAB_001177a7;
LAB_00117726:
      if ((x1->high_low_container).size <= (int)uVar7) {
LAB_0011786f:
        __assert_fail("i < ra->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1a3a,
                      "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                     );
      }
      (x1->high_low_container).containers[uVar8] = c;
      (x1->high_low_container).typecodes[uVar8] = local_45;
      uVar8 = (ulong)(uVar7 + 1);
      uVar9 = (uint)local_38;
    }
    else {
      if (uVar3 != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x11c6,"_Bool container_nonzero_cardinality(const container_t *, uint8_t)");
      }
      if (*piVar2 != 0) {
        if (*piVar2 != -1) goto LAB_00117726;
        lVar4 = 0;
        do {
          if (*(long *)(*(long *)(piVar2 + 2) + lVar4 * 8) != 0) goto LAB_00117726;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x400);
      }
LAB_001177a7:
      container_free(c,local_45);
      ra_remove_at_index(&x1->high_low_container,uVar7);
    }
    uVar10 = uVar10 + 1;
    uVar11 = (ulong)uVar10;
    uVar7 = (uint)uVar8;
    if ((uVar7 == uVar9) || (uVar10 == local_44)) {
LAB_00117828:
      if (uVar7 != uVar9) {
        return;
      }
LAB_0011782d:
      ra_append_copy_range
                (&x1->high_low_container,local_40,uVar10,local_44,(_Bool)(local_40->flags & 1));
      return;
    }
    uVar5 = (x1->high_low_container).keys[uVar7 & 0xffff];
    puVar1 = (ushort *)((ulong)((uVar10 & 0xffff) * 2) + (long)local_40->keys);
    uVar6 = (ulong)uVar9;
  } while( true );
}

Assistant:

void roaring_bitmap_xor_inplace(roaring_bitmap_t *x1,
                                const roaring_bitmap_t *x2) {
    assert(x1 != x2);
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }

    // XOR can have new containers inserted from x2, but can also
    // lose containers when x1 and x2 are nonempty and identical.

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared container.
            // Rationale: using a shared container safely with in place computation would
            // require making a copy and then doing the computation in place which is likely
            // less efficient than avoiding in place entirely and always generating a new
            // container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_xor(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // so release
            }
            else {
                c = container_ixor(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
                ++pos1;
            } else {
                container_free(c, result_type);
                ra_remove_at_index(&x1->high_low_container, pos1);
                --length1;
            }

            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }

            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}